

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolOccurrenceReplacement.cpp
# Opt level: O1

Formula * __thiscall
SymbolOccurrenceReplacement::process(SymbolOccurrenceReplacement *this,Formula *formula)

{
  Formula *pFVar1;
  void **head;
  Substitution substitution;
  
  pFVar1 = (Formula *)
           (*(code *)(&DAT_0093e5f8 + *(int *)(&DAT_0093e5f8 + (ulong)formula->_connective * 4)))();
  return pFVar1;
}

Assistant:

Formula* SymbolOccurrenceReplacement::process(Formula* formula) {
  switch (formula->connective()) {
    case LITERAL: {
      Literal* literal = formula->literal();

      bool renaming = _isPredicate && (literal->functor() == _symbol);

      TermList* arg = literal->args();
      TermStack arguments;
      Substitution substitution;

      if (renaming) {
        VList::Iterator fvit(_argVars);
        while (fvit.hasNext()) {
          unsigned var = fvit.next();
          substitution.bind(var, process(*arg));
          arg = arg->next();
        }
      } else {
        while (!arg->isEmpty()) {
          if(arg->isVar() || arg->term()->isSort()){
            arguments.push(*arg);
          } else {
            arguments.push(process(*arg));
          }
          arg = arg->next();
        }    
      }

      Literal* processedLiteral;
      if (renaming) {
        processedLiteral = SubstHelper::apply(static_cast<Literal*>(_freshApplication), substitution);
        if(!literal->polarity()){
          processedLiteral = Literal::complementaryLiteral(processedLiteral);
        }
      } else {
        processedLiteral = Literal::create(literal, arguments.begin());
      }

      return new AtomicFormula(processedLiteral);
    }

    case AND:
    case OR:
      return new JunctionFormula(formula->connective(), process(formula->args()));

    case IMP:
    case IFF:
    case XOR:
      return new BinaryFormula(formula->connective(), process(formula->left()), process(formula->right()));

    case NOT:
      return new NegatedFormula(process(formula->uarg()));

    case FORALL:
    case EXISTS:
      return new QuantifiedFormula(formula->connective(), formula->vars(), formula->sorts(), process(formula->qarg()));

    case BOOL_TERM:
      return new BoolTermFormula(process(formula->getBooleanTerm()));

    case TRUE:
    case FALSE:
      return formula;

    case NAME:
    case NOCONN:
      ASSERTION_VIOLATION;
    }

  ASSERTION_VIOLATION;
}